

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

void __thiscall
cfd::js::api::json::BlockInformation::ConvertFromStruct
          (BlockInformation *this,BlockInformationStruct *data)

{
  uint32_t uVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->block_hash_);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->tx_,&data->tx);
  this->version_ = data->version;
  std::__cxx11::string::_M_assign((string *)&this->version_hex_);
  std::__cxx11::string::_M_assign((string *)&this->previousblockhash_);
  std::__cxx11::string::_M_assign((string *)&this->merkleroot_);
  uVar1 = data->bits;
  this->time_ = data->time;
  this->bits_ = uVar1;
  this->nonce_ = data->nonce;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void BlockInformation::ConvertFromStruct(
    const BlockInformationStruct& data) {
  block_hash_ = data.block_hash;
  tx_.ConvertFromStruct(data.tx);
  version_ = data.version;
  version_hex_ = data.version_hex;
  previousblockhash_ = data.previousblockhash;
  merkleroot_ = data.merkleroot;
  time_ = data.time;
  bits_ = data.bits;
  nonce_ = data.nonce;
  ignore_items = data.ignore_items;
}